

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O1

Reals __thiscall
Omega_h::get_variation_metrics(Omega_h *this,Mesh *mesh,Real knob,Int dim,Int ncomps,Reals *data)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  LO LVar4;
  undefined8 uVar5;
  void *extraout_RDX;
  void *pvVar6;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  char *pcVar7;
  char *pcVar8;
  int comp;
  size_t sVar9;
  Alloc *pAVar10;
  bool bVar11;
  Reals RVar12;
  Reals vert_data;
  Reals vert_grads;
  Alloc *local_110;
  void *local_108;
  Alloc *local_100;
  void *local_f8;
  Real local_f0;
  Alloc **local_e8;
  Alloc **local_e0;
  Reals local_d8;
  Reals local_c8;
  Reals local_b8;
  Read<double> local_a8;
  Reals local_98;
  Reals local_88;
  long *local_78;
  undefined8 uStack_70;
  Reals local_60;
  Reals local_50;
  Reals local_40;
  
  pAVar10 = (data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar10 & 1) == 0) {
    sVar9 = pAVar10->size;
  }
  else {
    sVar9 = (ulong)pAVar10 >> 3;
  }
  local_f0 = knob;
  LVar4 = Mesh::nents(mesh,dim);
  if (LVar4 * ncomps != (int)(sVar9 >> 3)) {
    pcVar8 = "data.size() == mesh->nents(dim) * ncomps";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
    ;
    uVar5 = 0x2b;
    goto LAB_0036f22a;
  }
  if (ncomps == 1) {
    if (dim == 0) {
      local_40.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.write_.shared_alloc_.alloc)->use_count =
               (local_40.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_40.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
      recover_hessians((Omega_h *)&local_110,mesh,&local_40);
      pAVar10 = local_40.write_.shared_alloc_.alloc;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      uVar2 = mesh->dim_;
      if (3 < uVar2) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_88.write_.shared_alloc_.alloc = local_110;
      if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_88.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
        }
        else {
          local_110->use_count = local_110->use_count + 1;
        }
      }
      local_88.write_.shared_alloc_.direct_ptr = local_108;
      RVar12 = get_hessian_metrics(this,uVar2,&local_88,local_f0);
      pvVar6 = RVar12.write_.shared_alloc_.direct_ptr;
      pAVar10 = local_88.write_.shared_alloc_.alloc;
    }
    else {
      if (3 < (uint)mesh->dim_) {
        pcVar8 = "0 <= dim_ && dim_ <= 3";
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
        ;
        uVar5 = 0x33;
LAB_0036f22a:
        fail("assertion %s failed at %s +%d\n",pcVar8,pcVar7,uVar5);
      }
      if (mesh->dim_ != dim) {
        pcVar8 = "false";
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
        ;
        uVar5 = 0x42;
        goto LAB_0036f22a;
      }
      local_50.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_50.write_.shared_alloc_.alloc =
               (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_50.write_.shared_alloc_.alloc)->use_count =
               (local_50.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_50.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
      project_by_fit((Omega_h *)&local_110,mesh,&local_50);
      pAVar10 = local_50.write_.shared_alloc_.alloc;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      local_60.write_.shared_alloc_.alloc = local_110;
      if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
        }
        else {
          local_110->use_count = local_110->use_count + 1;
        }
      }
      local_60.write_.shared_alloc_.direct_ptr = local_108;
      recover_gradients((Omega_h *)&local_100,mesh,&local_60);
      pAVar10 = local_60.write_.shared_alloc_.alloc;
      if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      uVar2 = mesh->dim_;
      if (3 < uVar2) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_98.write_.shared_alloc_.alloc = local_100;
      if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_98.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
        }
        else {
          local_100->use_count = local_100->use_count + 1;
        }
      }
      local_98.write_.shared_alloc_.direct_ptr = local_f8;
      RVar12 = get_gradient_metrics(this,uVar2,&local_98,local_f0);
      pAVar3 = local_98.write_.shared_alloc_.alloc;
      pvVar6 = RVar12.write_.shared_alloc_.direct_ptr;
      pAVar10 = local_100;
      if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
          local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar6 = extraout_RDX_07;
          pAVar10 = local_100;
        }
      }
    }
    if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
      piVar1 = &pAVar10->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar10);
        operator_delete(pAVar10,0x48);
        pvVar6 = extraout_RDX_08;
      }
    }
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar1 = &local_110->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(local_110,0x48);
        pvVar6 = extraout_RDX_09;
      }
    }
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    pvVar6 = extraout_RDX;
    if (0 < ncomps) {
      comp = 0;
      local_e0 = &local_110;
      local_e8 = &local_100;
      do {
        local_a8.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
        if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a8.write_.shared_alloc_.alloc =
                 (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_a8.write_.shared_alloc_.alloc)->use_count =
                 (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_a8.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
        get_component<double>((Omega_h *)&local_110,&local_a8,ncomps,comp);
        pAVar10 = local_a8.write_.shared_alloc_.alloc;
        if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
            operator_delete(pAVar10,0x48);
          }
        }
        local_b8.write_.shared_alloc_.alloc = local_110;
        if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b8.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
          }
          else {
            local_110->use_count = local_110->use_count + 1;
          }
        }
        local_b8.write_.shared_alloc_.direct_ptr = local_108;
        RVar12 = get_variation_metrics((Omega_h *)&local_100,mesh,local_f0,dim,1,&local_b8);
        pAVar10 = local_b8.write_.shared_alloc_.alloc;
        pvVar6 = RVar12.write_.shared_alloc_.direct_ptr;
        if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
            operator_delete(pAVar10,0x48);
            pvVar6 = extraout_RDX_00;
          }
        }
        if (comp == 0) {
          pAVar10 = *(Alloc **)this;
          if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
            piVar1 = &pAVar10->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar10);
              operator_delete(pAVar10,0x48);
              pvVar6 = extraout_RDX_01;
            }
          }
          *(Alloc **)this = local_100;
          bVar11 = ((ulong)local_100 & 7) != 0;
          pvVar6 = (void *)CONCAT71((int7)((ulong)pvVar6 >> 8),bVar11 || local_100 == (Alloc *)0x0);
          if (!bVar11 && local_100 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              *(size_t *)this = local_100->size * 8 + 1;
            }
            else {
              local_100->use_count = local_100->use_count + 1;
            }
          }
          *(void **)(this + 8) = local_f8;
        }
        else {
          LVar4 = Mesh::nverts(mesh);
          local_c8.write_.shared_alloc_.alloc = *(Alloc **)this;
          if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_c8.write_.shared_alloc_.alloc =
                   (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_c8.write_.shared_alloc_.alloc)->use_count =
                   (local_c8.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_c8.write_.shared_alloc_.direct_ptr = *(void **)(this + 8);
          local_d8.write_.shared_alloc_.alloc = local_100;
          if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_d8.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
            }
            else {
              local_100->use_count = local_100->use_count + 1;
            }
          }
          local_d8.write_.shared_alloc_.direct_ptr = local_f8;
          RVar12 = intersect_metrics((Omega_h *)&local_78,LVar4,&local_c8,&local_d8);
          pvVar6 = RVar12.write_.shared_alloc_.direct_ptr;
          pAVar10 = *(Alloc **)this;
          if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
            piVar1 = &pAVar10->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar10);
              operator_delete(pAVar10,0x48);
              pvVar6 = extraout_RDX_02;
            }
          }
          pAVar10 = local_d8.write_.shared_alloc_.alloc;
          *(long **)this = local_78;
          *(undefined8 *)(this + 8) = uStack_70;
          bVar11 = ((ulong)local_78 & 7) != 0;
          pvVar6 = (void *)CONCAT71((int7)((ulong)pvVar6 >> 8),bVar11 || local_78 == (long *)0x0);
          if ((!bVar11 && local_78 != (long *)0x0) && (entering_parallel == '\x01')) {
            *(int *)(local_78 + 6) = (int)local_78[6] + -1;
            *(long *)this = *local_78 * 8 + 1;
          }
          local_78 = (long *)0x0;
          uStack_70 = 0;
          if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
              pvVar6 = extraout_RDX_03;
            }
          }
          pAVar10 = local_c8.write_.shared_alloc_.alloc;
          if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
              operator_delete(pAVar10,0x48);
              pvVar6 = extraout_RDX_04;
            }
          }
        }
        pAVar10 = local_100;
        if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
          piVar1 = &local_100->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_100);
            operator_delete(pAVar10,0x48);
            pvVar6 = extraout_RDX_05;
          }
        }
        pAVar10 = local_110;
        if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
          piVar1 = &local_110->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_110);
            operator_delete(pAVar10,0x48);
            pvVar6 = extraout_RDX_06;
          }
        }
        comp = comp + 1;
      } while (ncomps != comp);
    }
  }
  RVar12.write_.shared_alloc_.direct_ptr = pvVar6;
  RVar12.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar12.write_.shared_alloc_;
}

Assistant:

static Reals get_variation_metrics(
    Mesh* mesh, Real knob, Int dim, Int ncomps, Reals data) {
  OMEGA_H_CHECK(data.size() == mesh->nents(dim) * ncomps);
  if (ncomps == 1) {
    if (dim == VERT) {
      auto hessians = recover_hessians(mesh, data);
      return get_hessian_metrics(mesh->dim(), hessians, knob);
    } else if (dim == mesh->dim()) {
      auto vert_data = project_by_fit(mesh, data);
      auto vert_grads = recover_gradients(mesh, vert_data);
      return get_gradient_metrics(mesh->dim(), vert_grads, knob);
    }
  } else {
    Reals metrics;
    for (Int comp = 0; comp < ncomps; ++comp) {
      auto comp_data = get_component(data, ncomps, comp);
      auto comp_metrics = get_variation_metrics(mesh, knob, dim, 1, comp_data);
      if (comp) {
        metrics = intersect_metrics(mesh->nverts(), metrics, comp_metrics);
      } else {
        metrics = comp_metrics;
      }
    }
    return metrics;
  }
  OMEGA_H_NORETURN(Reals());
}